

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericvar.cpp
# Opt level: O2

void __thiscall MetaSim::GenericVar::readPDF(GenericVar *this,ifstream *f,int mode)

{
  mapped_type *pmVar1;
  ostream *poVar2;
  double *pdVar3;
  Exc *pEVar4;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *this_00;
  allocator local_109;
  double local_108;
  int n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  mapped_type local_d8;
  double p;
  string errMsg;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = &this->_pdf;
  local_108 = 0.0;
  while( true ) {
    do {
      if (((byte)f[*(long *)(*(long *)f + -0x18) + 0x20] & 2) != 0) {
        if (1.0 < local_108) {
          std::__cxx11::string::string((string *)&local_f8,"\n",&local_109);
          std::operator+(&errMsg,"Malformed PDF",&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          pEVar4 = (Exc *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&local_88,(string *)&errMsg);
          std::__cxx11::string::string((string *)&local_a8,"GenericVar",(allocator *)&local_f8);
          RandomVar::Exc::Exc(pEVar4,&local_88,&local_a8);
          __cxa_throw(pEVar4,&RandomVar::Exc::typeinfo,BaseExc::~BaseExc);
        }
        if (local_108 < 0.99999999999) {
          std::operator<<((ostream *)&std::cerr,"Warning: PDF values sum to ");
          poVar2 = std::ostream::_M_insert<double>(local_108);
          std::operator<<(poVar2," < 1\n");
          local_108 = 1.0 - local_108;
          if (mode == 0) {
            pdVar3 = std::
                     map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     ::operator[](this_00,&n);
          }
          else {
            errMsg._M_dataplus._M_p._0_4_ = 1;
            pdVar3 = std::
                     map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     ::operator[](this_00,(key_type *)&errMsg);
          }
          *pdVar3 = local_108 + *pdVar3;
        }
        return;
      }
      std::istream::operator>>((istream *)f,&n);
      std::istream::_M_extract<double>((double *)f);
    } while (((byte)f[*(long *)(*(long *)f + -0x18) + 0x20] & 2) != 0);
    pmVar1 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](this_00,&n);
    if ((*pmVar1 != 0.0) || (NAN(*pmVar1))) break;
    local_d8 = p;
    local_108 = local_108 + p;
    pmVar1 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](this_00,&n);
    *pmVar1 = local_d8;
  }
  std::__cxx11::string::string((string *)&local_f8,"\n",&local_109);
  std::operator+(&errMsg,"Malformed PDF",&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  pEVar4 = (Exc *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_48,(string *)&errMsg);
  std::__cxx11::string::string((string *)&local_68,"GenericVar",(allocator *)&local_f8);
  RandomVar::Exc::Exc(pEVar4,&local_48,&local_68);
  __cxa_throw(pEVar4,&RandomVar::Exc::typeinfo,BaseExc::~BaseExc);
}

Assistant:

void GenericVar::readPDF(ifstream &f, int mode)
    {
        int n;
        double p;
        double sum;

        sum = 0;
        while(!f.eof()) {
            f >> n;
            f >> p;
#ifdef __DEBUG__
            cout << n << "\t" << p << "\n";
#endif
            if (!f.eof()) {
                if (_pdf[n] != 0) {
                    string errMsg = Exc::_WRONGPDF + string("\n");
                    throw Exc(errMsg, "GenericVar");
                }
                sum += p;
                _pdf[n] = p;
            }
        }

        if (sum > 1) {
            string errMsg = Exc::_WRONGPDF + string("\n");
            throw Exc(errMsg, "GenericVar");
        }

        if (sum < (1.0 - PDF_ERR)) {
            cerr << "Warning: PDF values sum to " << sum << " < 1\n";
            if (mode == 0) {
                _pdf[n] += (1 - sum);
            } else {
                _pdf[1] += (1 - sum);
            }
        }
    }